

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O2

int __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)10>::Move_iterator::remove
          (Move_iterator *this,char *__filename)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  long in_RDX;
  
  __mutex = *(pthread_mutex_t **)__filename;
  std::mutex::lock((mutex *)&__mutex->__data);
  lVar1 = **(long **)(__filename + 0x38);
  this->mtx_ = *(Mutex_t **)(lVar1 + in_RDX * 8);
  *(undefined8 *)(lVar1 + in_RDX * 8) = 0;
  pthread_mutex_unlock(__mutex);
  return (int)this;
}

Assistant:

auto remove(Size_t at) -> std::unique_ptr<Event>
            {
                Guard_t g{mtx_};
                return std::move(events_[at]);
            }